

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fitscore.c
# Opt level: O2

int ffainit(fitsfile *fptr,int *status)

{
  long lVar1;
  long lVar2;
  LONGLONG *pLVar3;
  int iVar4;
  FITSfile *pFVar5;
  tcolumn *ptVar6;
  size_t sVar7;
  long lVar8;
  int iVar9;
  size_t sVar10;
  long lVar11;
  ulong uVar12;
  int iVar13;
  uint uVar14;
  ulong uVar15;
  char *pcVar16;
  LONGLONG rowlen;
  long tfield;
  LONGLONG nrows;
  LONGLONG pcount;
  char name [75];
  char message [81];
  char value [71];
  char comm [73];
  
  if (0 < *status) {
    return *status;
  }
  pFVar5 = fptr->Fptr;
  if (fptr->HDUposition != pFVar5->curhdu) {
    ffmahd(fptr,fptr->HDUposition + 1,(int *)0x0,status);
    pFVar5 = fptr->Fptr;
  }
  pFVar5->hdutype = 1;
  pFVar5->headend = pFVar5->logfilesize;
  iVar4 = ffgttb(fptr,&rowlen,&nrows,&pcount,&tfield,status);
  if (0 < iVar4) {
    return *status;
  }
  if (pcount != 0) {
    ffpmsg("PCOUNT keyword not equal to 0 in ASCII table (ffainit).");
    snprintf(message,0x51,"  PCOUNT = %ld",pcount);
    ffpmsg(message);
    *status = 0xd6;
    return 0xd6;
  }
  pFVar5 = fptr->Fptr;
  pFVar5->rowlength = rowlen;
  pFVar5->tfield = (int)tfield;
  if (pFVar5->tilerow != (int *)0x0) {
    uVar14 = (int)((pFVar5->znaxis[0] + -1) / pFVar5->tilesize[0]) + 1;
    uVar12 = 0;
    uVar15 = (ulong)uVar14;
    if ((int)uVar14 < 1) {
      uVar15 = uVar12;
    }
    for (; uVar15 != uVar12; uVar12 = uVar12 + 1) {
      free(fptr->Fptr->tiledata[uVar12]);
      free(fptr->Fptr->tilenullarray[uVar12]);
    }
    free(fptr->Fptr->tileanynull);
    free(fptr->Fptr->tiletype);
    free(fptr->Fptr->tiledatasize);
    free(fptr->Fptr->tilenullarray);
    free(fptr->Fptr->tiledata);
    free(fptr->Fptr->tilerow);
    pFVar5 = fptr->Fptr;
    pFVar5->tilenullarray = (void **)0x0;
    pFVar5->tileanynull = (int *)0x0;
    pFVar5->tiletype = (int *)0x0;
    pFVar5->tiledata = (void **)0x0;
    pFVar5->tilerow = (int *)0x0;
    pFVar5->tiledatasize = (long *)0x0;
  }
  free(pFVar5->tableptr);
  sVar7 = CONCAT44(tfield._4_4_,(int)tfield);
  if ((long)sVar7 < 1) {
    ptVar6 = (tcolumn *)0x0;
  }
  else {
    ptVar6 = (tcolumn *)calloc(sVar7,0xa0);
    if (ptVar6 == (tcolumn *)0x0) {
      ffpmsg("malloc failed to get memory for FITS table descriptors (ffainit)");
      fptr->Fptr->tableptr = (tcolumn *)0x0;
      *status = 0x6f;
      return 0x6f;
    }
  }
  pFVar5 = fptr->Fptr;
  pFVar5->tableptr = ptVar6;
  sVar10 = 0;
  if (0 < (long)sVar7) {
    sVar10 = sVar7;
  }
  while (sVar10 != 0) {
    ptVar6->ttype[0] = '\0';
    ptVar6->tscale = 1.0;
    ptVar6->tzero = 0.0;
    ptVar6->strnull[0] = '\x01';
    ptVar6->tbcol = -1;
    ptVar6->tdatatype = -9999;
    ptVar6 = ptVar6 + 1;
    sVar10 = sVar10 - 1;
  }
  pFVar5->numrows = nrows;
  pFVar5->origrows = nrows;
  pFVar5->heapstart = nrows * rowlen;
  pFVar5->heapsize = 0;
  pFVar5->compressimg = 0;
  iVar4 = 8;
  iVar13 = 0;
  do {
    ffgkyn(fptr,iVar4,name,value,comm,status);
    iVar9 = *status;
    if (iVar9 == 0xcd) {
      sVar7 = strlen(value);
      (value + sVar7)[0] = '\'';
      (value + sVar7)[1] = '\0';
LAB_00138f05:
      *status = 0;
      iVar9 = 0;
    }
    else {
      if (iVar9 == 0xcf) goto LAB_00138f05;
      if (iVar9 == 0x6b) {
        ffpmsg("END keyword not found in ASCII table header (ffainit).");
        *status = 0xd2;
        return 0xd2;
      }
      if (0 < iVar9) {
        return iVar9;
      }
    }
    if (name[0] == 'T') {
      ffgtbp(fptr,name,value,status);
      uVar14 = name._0_4_ & 0xff;
    }
    else {
      uVar14 = name._0_4_;
      if (name[0] == 'E' && name._0_4_ == 0x444e45) {
        lVar8 = 0;
        lVar11 = CONCAT44(tfield._4_4_,(int)tfield);
        if (CONCAT44(tfield._4_4_,(int)tfield) < 1) {
          lVar11 = lVar8;
        }
        pFVar5 = fptr->Fptr;
        pcVar16 = pFVar5->tableptr->tform;
        while( true ) {
          if (lVar11 == lVar8) {
            pLVar3 = pFVar5->headstart;
            lVar11 = pFVar5->nextkey;
            pFVar5->headend = lVar11 - (iVar13 * 0x50 + 0x50);
            lVar11 = lVar11 - (lVar11 + -0x50) % 0xb40;
            pFVar5->datastart = lVar11 + 0xaf0;
            iVar4 = pFVar5->curhdu;
            pLVar3[(long)iVar4 + 1] =
                 (nrows * rowlen + lVar11 + 0x162f) - (nrows * rowlen + 0xb3f) % 0xb40;
            pFVar5->nextkey = pLVar3[iVar4];
            return iVar9;
          }
          iVar4 = (int)lVar8;
          if (*(int *)(pcVar16 + -0x3c) == -9999) break;
          lVar1 = *(long *)(pcVar16 + -0x44);
          if (lVar1 == -1) {
            ffkeyn("TBCOL",iVar4 + 1,name,status);
            snprintf(message,0x51,"Required %s keyword not found (ffainit).",name);
            ffpmsg(message);
            *status = 0xe7;
            return 0xe7;
          }
          lVar2 = pFVar5->rowlength;
          if (lVar2 != 0) {
            if ((lVar1 < 0) || (lVar2 <= lVar1)) {
              ffkeyn("TBCOL",iVar4 + 1,name,status);
              snprintf(message,0x51,"Value of %s keyword out of range: %ld (ffainit).",name,lVar1);
              ffpmsg(message);
              *status = 0xea;
              return 0xea;
            }
            if (lVar2 < lVar1 + *(long *)(pcVar16 + 0xc)) {
              snprintf(message,0x51,"Column %d is too wide to fit in table (ffainit)",
                       (ulong)(iVar4 + 1));
              ffpmsg(message);
              snprintf(message,0x51," TFORM = %s and NAXIS1 = %ld",pcVar16,fptr->Fptr->rowlength);
              ffpmsg(message);
              *status = 0xec;
              return 0xec;
            }
          }
          lVar8 = lVar8 + 1;
          pcVar16 = pcVar16 + 0xa0;
        }
        ffkeyn("TFORM",iVar4 + 1,name,status);
        snprintf(message,0x51,"Required %s keyword not found (ffainit).",name);
        ffpmsg(message);
        *status = 0xe8;
        return 0xe8;
      }
    }
    iVar13 = iVar13 + 1;
    if (((char)uVar14 != '\0' || value[0] != '\0') || comm[0] != '\0') {
      iVar13 = 0;
    }
    iVar4 = iVar4 + 1;
  } while( true );
}

Assistant:

int ffainit(fitsfile *fptr,      /* I - FITS file pointer */
            int *status)         /* IO - error status     */
{
/*
  initialize the parameters defining the structure of an ASCII table 
*/
    int  ii, nspace, ntilebins;
    long tfield;
    LONGLONG pcount, rowlen, nrows, tbcoln;
    tcolumn *colptr = 0;
    char name[FLEN_KEYWORD], value[FLEN_VALUE], comm[FLEN_COMMENT];
    char message[FLEN_ERRMSG], errmsg[FLEN_ERRMSG];

    if (*status > 0)
        return(*status);

    /* reset position to the correct HDU if necessary */
    if (fptr->HDUposition != (fptr->Fptr)->curhdu)
        ffmahd(fptr, (fptr->HDUposition) + 1, NULL, status);

    (fptr->Fptr)->hdutype = ASCII_TBL;  /* set that this is an ASCII table */
    (fptr->Fptr)->headend = (fptr->Fptr)->logfilesize;  /* set max size */

    /* get table parameters and test that the header is a valid: */
    if (ffgttb(fptr, &rowlen, &nrows, &pcount, &tfield, status) > 0)  
       return(*status);

    if (pcount != 0)
    {
       ffpmsg("PCOUNT keyword not equal to 0 in ASCII table (ffainit).");
       snprintf(errmsg, FLEN_ERRMSG,"  PCOUNT = %ld", (long) pcount);
       ffpmsg(errmsg);
       return(*status = BAD_PCOUNT);
    }

    (fptr->Fptr)->rowlength = rowlen; /* store length of a row */
    (fptr->Fptr)->tfield = tfield; /* store number of table fields in row */

     /* free the tile-compressed image cache, if it exists */
     if ((fptr->Fptr)->tilerow) {

           ntilebins = 
	    (((fptr->Fptr)->znaxis[0] - 1) / ((fptr->Fptr)->tilesize[0])) + 1;

           for (ii = 0; ii < ntilebins; ii++) {
             if ((fptr->Fptr)->tiledata[ii]) {
	       free((fptr->Fptr)->tiledata[ii]);
             }

             if ((fptr->Fptr)->tilenullarray[ii]) {
	       free((fptr->Fptr)->tilenullarray[ii]);
             }
            }
	    
	    free((fptr->Fptr)->tileanynull);
	    free((fptr->Fptr)->tiletype);	   
	    free((fptr->Fptr)->tiledatasize);
	    free((fptr->Fptr)->tilenullarray);
	    free((fptr->Fptr)->tiledata);
	    free((fptr->Fptr)->tilerow);

	    (fptr->Fptr)->tileanynull = 0;
	    (fptr->Fptr)->tiletype = 0;	   
	    (fptr->Fptr)->tiledatasize = 0;
	    (fptr->Fptr)->tilenullarray = 0;
	    (fptr->Fptr)->tiledata = 0;
	    (fptr->Fptr)->tilerow = 0;
     }

    if ((fptr->Fptr)->tableptr)
       free((fptr->Fptr)->tableptr); /* free memory for the old CHDU */

    /* mem for column structures ; space is initialized = 0 */
    if (tfield > 0)
    {
      colptr = (tcolumn *) calloc(tfield, sizeof(tcolumn) );
      if (!colptr)
      {
        ffpmsg
        ("malloc failed to get memory for FITS table descriptors (ffainit)");
        (fptr->Fptr)->tableptr = 0;  /* set a null table structure pointer */
        return(*status = ARRAY_TOO_BIG);
      }
    }

    /* copy the table structure address to the fitsfile structure */
    (fptr->Fptr)->tableptr = colptr; 

    /*  initialize the table field parameters */
    for (ii = 0; ii < tfield; ii++, colptr++)
    {
        colptr->ttype[0] = '\0';  /* null column name */
        colptr->tscale = 1.;
        colptr->tzero  = 0.;
        colptr->strnull[0] = ASCII_NULL_UNDEFINED;  /* null value undefined */
        colptr->tbcol = -1;          /* initialize to illegal value */
        colptr->tdatatype = -9999;   /* initialize to illegal value */
    }

    /*
      Initialize the fictitious heap starting address (immediately following
      the table data) and a zero length heap.  This is used to find the
      end of the table data when checking the fill values in the last block. 
      There is no special data following an ASCII table.
    */
    (fptr->Fptr)->numrows = nrows;
    (fptr->Fptr)->origrows = nrows;
    (fptr->Fptr)->heapstart = rowlen * nrows;
    (fptr->Fptr)->heapsize = 0;

    (fptr->Fptr)->compressimg = 0;  /* this is not a compressed image */

    /* now search for the table column keywords and the END keyword */

    for (nspace = 0, ii = 8; 1; ii++)  /* infinite loop  */
    {
        ffgkyn(fptr, ii, name, value, comm, status);

        /* try to ignore minor syntax errors */
        if (*status == NO_QUOTE)
        {
            strcat(value, "'");
            *status = 0;
        }
        else if (*status == BAD_KEYCHAR)
        {
            *status = 0;
        }

        if (*status == END_OF_FILE)
        {
            ffpmsg("END keyword not found in ASCII table header (ffainit).");
            return(*status = NO_END);
        }
        else if (*status > 0)
            return(*status);

        else if (name[0] == 'T')   /* keyword starts with 'T' ? */
            ffgtbp(fptr, name, value, status); /* test if column keyword */

        else if (!FSTRCMP(name, "END"))  /* is this the END keyword? */
            break;

        if (!name[0] && !value[0] && !comm[0])  /* a blank keyword? */
            nspace++;

        else
            nspace = 0;
    }

    /* test that all required keywords were found and have legal values */
    colptr = (fptr->Fptr)->tableptr;
    for (ii = 0; ii < tfield; ii++, colptr++)
    {
        tbcoln = colptr->tbcol;  /* the starting column number (zero based) */

        if (colptr->tdatatype == -9999)
        {
            ffkeyn("TFORM", ii+1, name, status);  /* construct keyword name */
            snprintf(message,FLEN_ERRMSG,"Required %s keyword not found (ffainit).", name);
            ffpmsg(message);
            return(*status = NO_TFORM);
        }

        else if (tbcoln == -1)
        {
            ffkeyn("TBCOL", ii+1, name, status); /* construct keyword name */
            snprintf(message,FLEN_ERRMSG,"Required %s keyword not found (ffainit).", name);
            ffpmsg(message);
            return(*status = NO_TBCOL);
        }

        else if ((fptr->Fptr)->rowlength != 0 && 
                (tbcoln < 0 || tbcoln >= (fptr->Fptr)->rowlength ) )
        {
            ffkeyn("TBCOL", ii+1, name, status);  /* construct keyword name */
            snprintf(message,FLEN_ERRMSG,"Value of %s keyword out of range: %ld (ffainit).",
            name, (long) tbcoln);
            ffpmsg(message);
            return(*status = BAD_TBCOL);
        }

        else if ((fptr->Fptr)->rowlength != 0 && 
                 tbcoln + colptr->twidth > (fptr->Fptr)->rowlength )
        {
            snprintf(message,FLEN_ERRMSG,"Column %d is too wide to fit in table (ffainit)",
            ii+1);
            ffpmsg(message);
            snprintf(message, FLEN_ERRMSG," TFORM = %s and NAXIS1 = %ld",
                    colptr->tform, (long) (fptr->Fptr)->rowlength);
            ffpmsg(message);
            return(*status = COL_TOO_WIDE);
        }
    }

    /*
      now we know everything about the table; just fill in the parameters:
      the 'END' record is 80 bytes before the current position, minus
      any trailing blank keywords just before the END keyword.
    */
    (fptr->Fptr)->headend = (fptr->Fptr)->nextkey - (80 * (nspace + 1));
 
    /* the data unit begins at the beginning of the next logical block */
    (fptr->Fptr)->datastart = (((fptr->Fptr)->nextkey - 80) / 2880 + 1) 
                              * 2880;

    /* the next HDU begins in the next logical block after the data  */
    (fptr->Fptr)->headstart[ (fptr->Fptr)->curhdu + 1] =
         (fptr->Fptr)->datastart +
         ( ((LONGLONG)rowlen * nrows + 2879) / 2880 * 2880 );

    /* reset next keyword pointer to the start of the header */
    (fptr->Fptr)->nextkey = (fptr->Fptr)->headstart[ (fptr->Fptr)->curhdu ];

    return(*status);
}